

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseDoesNotHaveSideEffectsWhenPassing::RunImpl
          (TestCheckCloseDoesNotHaveSideEffectsWhenPassing *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_b8;
  int local_94 [9];
  TestDetails local_70;
  float local_50;
  int local_4c [5];
  undefined1 local_38 [8];
  ScopedCurrentTest scopedResults;
  TestResults testResults;
  TestCheckCloseDoesNotHaveSideEffectsWhenPassing *this_local;
  
  (anonymous_namespace)::g_sideEffect = 0;
  UnitTest::TestResults::TestResults
            ((TestResults *)&scopedResults.m_oldTestDetails,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_38,(TestResults *)&scopedResults.m_oldTestDetails,
             (TestDetails *)0x0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_4c[1] = 1;
  local_4c[0] = FunctionWithSideEffects();
  local_50 = 0.1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_70,*ppTVar3,0x139);
  UnitTest::CheckClose<int,int,float>(pTVar1,local_4c + 1,local_4c,&local_50,&local_70);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_38);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_94[0] = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_b8,*ppTVar3,0x13b);
  UnitTest::CheckEqual<int,int>(pTVar1,local_94,&(anonymous_namespace)::g_sideEffect,&local_b8);
  return;
}

Assistant:

TEST(CheckCloseDoesNotHaveSideEffectsWhenPassing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE (1, FunctionWithSideEffects(), 0.1f);
    }
    CHECK_EQUAL(1, g_sideEffect);
}